

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Glob.cxx
# Opt level: O3

void __thiscall
kwssys::Glob::ProcessDirectory(Glob *this,size_type start,string *dir,GlobMessages *messages)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  size_type sVar3;
  bool bVar4;
  int iVar5;
  ulong uVar6;
  Status SVar7;
  unsigned_long uVar8;
  char *__s;
  long *plVar9;
  size_type *psVar10;
  _Alloc_hider _Var11;
  RegularExpression *this_00;
  Directory d;
  string fname;
  string realname;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  Directory local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  size_type local_b8;
  string local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_90 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  size_type local_70;
  GlobMessages *local_68;
  long local_60;
  ulong local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  uVar6 = ((long)(this->Internals->Expressions).
                 super__Vector_base<kwssys::RegularExpression,_std::allocator<kwssys::RegularExpression>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->Internals->Expressions).
                 super__Vector_base<kwssys::RegularExpression,_std::allocator<kwssys::RegularExpression>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5075075075075075;
  local_b8 = uVar6 - 1;
  if ((local_b8 == start) && (this->Recurse == true)) {
    bVar4 = SystemTools::FileIsDirectory(dir);
    if (bVar4) {
      RecurseDirectory(this,start,dir,messages);
      return;
    }
  }
  else if (start <= uVar6 && uVar6 - start != 0) {
    Directory::Directory(&local_e0);
    SVar7 = Directory::Load(&local_e0,dir,(string *)0x0);
    if (SVar7.Kind_ == Success) {
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      local_b0._M_string_length = 0;
      local_b0.field_2._M_local_buf[0] = '\0';
      local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
      local_d8._M_string_length = 0;
      local_d8.field_2._M_local_buf[0] = '\0';
      paVar1 = &local_50.field_2;
      local_70 = start + 1;
      local_60 = start * 0x230;
      local_68 = messages;
      for (uVar6 = 0; uVar8 = Directory::GetNumberOfFiles(&local_e0), uVar6 < uVar8;
          uVar6 = uVar6 + 1) {
        __s = Directory::GetFile(&local_e0,uVar6);
        sVar3 = local_d8._M_string_length;
        local_58 = uVar6;
        strlen(__s);
        uVar6 = local_58;
        std::__cxx11::string::_M_replace((ulong)&local_d8,0,(char *)sVar3,(ulong)__s);
        iVar5 = std::__cxx11::string::compare((char *)&local_d8);
        if ((iVar5 != 0) && (iVar5 = std::__cxx11::string::compare((char *)&local_d8), iVar5 != 0))
        {
          if (start == 0) {
            std::operator+(&local_50,dir,&local_d8);
            std::__cxx11::string::operator=((string *)&local_b0,(string *)&local_50);
            _Var11._M_p = local_50._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != paVar1) goto LAB_0015dae6;
          }
          else {
            local_90[0] = &local_80;
            pcVar2 = (dir->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_90,pcVar2,pcVar2 + dir->_M_string_length);
            std::__cxx11::string::append((char *)local_90);
            plVar9 = (long *)std::__cxx11::string::_M_append
                                       ((char *)local_90,(ulong)local_d8._M_dataplus._M_p);
            psVar10 = (size_type *)(plVar9 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar9 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar10) {
              local_50.field_2._M_allocated_capacity = *psVar10;
              local_50.field_2._8_8_ = plVar9[3];
              local_50._M_dataplus._M_p = (pointer)paVar1;
            }
            else {
              local_50.field_2._M_allocated_capacity = *psVar10;
              local_50._M_dataplus._M_p = (pointer)*plVar9;
            }
            local_50._M_string_length = plVar9[1];
            *plVar9 = (long)psVar10;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            std::__cxx11::string::operator=((string *)&local_b0,(string *)&local_50);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != paVar1) {
              operator_delete(local_50._M_dataplus._M_p);
            }
            _Var11._M_p = (pointer)local_90[0];
            if (local_90[0] != &local_80) {
LAB_0015dae6:
              operator_delete(_Var11._M_p);
            }
          }
          if (local_b8 == start) {
            if ((this->ListDirs != false) ||
               (bVar4 = SystemTools::FileIsDirectory(&local_b0), !bVar4)) {
LAB_0015db1f:
              this_00 = (RegularExpression *)
                        ((long)(((this->Internals->Expressions).
                                 super__Vector_base<kwssys::RegularExpression,_std::allocator<kwssys::RegularExpression>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->regmatch).startp +
                        local_60);
              bVar4 = RegularExpression::find
                                (this_00,local_d8._M_dataplus._M_p,(RegularExpressionMatch *)this_00
                                );
              if (bVar4) {
                if (local_b8 == start) {
                  AddFile(this,&this->Internals->Files,&local_b0);
                }
                else {
                  ProcessDirectory(this,local_70,&local_b0,local_68);
                }
              }
            }
          }
          else {
            bVar4 = SystemTools::FileIsDirectory(&local_b0);
            if (bVar4) goto LAB_0015db1f;
          }
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
    }
    Directory::~Directory(&local_e0);
  }
  return;
}

Assistant:

void Glob::ProcessDirectory(std::string::size_type start,
                            const std::string& dir, GlobMessages* messages)
{
  // std::cout << "ProcessDirectory: " << dir << std::endl;
  bool last = (start == this->Internals->Expressions.size() - 1);
  if (last && this->Recurse) {
    if (kwsys::SystemTools::FileIsDirectory(dir)) {
      this->RecurseDirectory(start, dir, messages);
    }
    return;
  }

  if (start >= this->Internals->Expressions.size()) {
    return;
  }

  kwsys::Directory d;
  if (!d.Load(dir)) {
    return;
  }
  unsigned long cc;
  std::string realname;
  std::string fname;
  for (cc = 0; cc < d.GetNumberOfFiles(); cc++) {
    fname = d.GetFile(cc);
    if (fname == "." || fname == "..") {
      continue;
    }

    if (start == 0) {
      realname = dir + fname;
    } else {
      realname = dir + "/" + fname;
    }

#if defined(KWSYS_GLOB_CASE_INDEPENDENT)
    // On case-insensitive file systems convert to lower case for matching.
    fname = kwsys::SystemTools::LowerCase(fname);
#endif

    // std::cout << "Look at file: " << fname << std::endl;
    // std::cout << "Match: "
    // << this->Internals->TextExpressions[start].c_str() << std::endl;
    // std::cout << "Real name: " << realname << std::endl;

    if ((!last && !kwsys::SystemTools::FileIsDirectory(realname)) ||
        (!this->ListDirs && last &&
         kwsys::SystemTools::FileIsDirectory(realname))) {
      continue;
    }

    if (this->Internals->Expressions[start].find(fname)) {
      if (last) {
        this->AddFile(this->Internals->Files, realname);
      } else {
        this->ProcessDirectory(start + 1, realname, messages);
      }
    }
  }
}